

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorIncompatibleTarget::iterate
          (TransformFeedbackOverflowQueryErrorIncompatibleTarget *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "BeginQuery[Indexed] must generate INVALID_OPERATION if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and the specified query was previously used with another target."
  ;
  (**(code **)(lVar3 + 0x20))(0x82ec,this->m_incompatible_query);
  TransformFeedbackOverflowQueryErrorBase::verifyError
            (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
  (**(code **)(lVar3 + 0x28))(0x82ec,0,this->m_incompatible_query);
  TransformFeedbackOverflowQueryErrorBase::verifyError
            (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(lVar3 + 0x20))(0x82ec,this->m_stream_overflow_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
    (**(code **)(lVar3 + 0x28))(0x82ec,0,this->m_stream_overflow_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "BeginQuery[Indexed] must generate INVALID_OPERATION if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and the specified query was previously used with another target."
    ;
    (**(code **)(lVar3 + 0x20))(0x82ed,this->m_incompatible_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
    (**(code **)(lVar3 + 0x28))(0x82ed,2,this->m_incompatible_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
    (**(code **)(lVar3 + 0x20))(0x82ed,this->m_overflow_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
    (**(code **)(lVar3 + 0x28))(0x82ed,2,this->m_overflow_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x502);
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		startTest("BeginQuery[Indexed] must generate INVALID_OPERATION if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and the specified query was "
				  "previously used with another target.");

		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_incompatible_query);
		verifyError(GL_INVALID_OPERATION);
		gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, m_incompatible_query);
		verifyError(GL_INVALID_OPERATION);

		if (supportsTransformFeedback3())
		{
			gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_stream_overflow_query);
			verifyError(GL_INVALID_OPERATION);
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, m_stream_overflow_query);
			verifyError(GL_INVALID_OPERATION);

			startTest("BeginQuery[Indexed] must generate INVALID_OPERATION if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and the specified query "
					  "was previously used with another target.");

			gl.beginQuery(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_incompatible_query);
			verifyError(GL_INVALID_OPERATION);
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, 2, m_incompatible_query);
			verifyError(GL_INVALID_OPERATION);

			gl.beginQuery(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_overflow_query);
			verifyError(GL_INVALID_OPERATION);
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, 2, m_overflow_query);
			verifyError(GL_INVALID_OPERATION);
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}